

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

void htmlParseReference(htmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  htmlEntityDesc *phVar5;
  charactersSAXFunc p_Var6;
  uint uVar7;
  char *pcVar8;
  void *pvVar9;
  ulong uVar10;
  xmlChar out [6];
  xmlChar *name;
  byte local_26 [6];
  xmlChar *local_20;
  
  pxVar1 = ctxt->input->cur;
  if (*pxVar1 != '&') {
    return;
  }
  if (pxVar1[1] == '#') {
    uVar3 = htmlParseCharRef(ctxt);
    if (uVar3 == 0) {
      return;
    }
    if (uVar3 < 0x80) {
LAB_00151977:
      local_26[0] = (byte)uVar3;
      uVar10 = 1;
    }
    else {
      if (uVar3 < 0x800) {
        local_26[0] = (byte)(uVar3 >> 6) | 0xc0;
        uVar7 = 0;
      }
      else if (uVar3 < 0x10000) {
        local_26[0] = (byte)(uVar3 >> 0xc) | 0xe0;
        uVar7 = 6;
      }
      else {
        local_26[0] = (byte)(uVar3 >> 0x12) & 7 | 0xf0;
        uVar7 = 0xc;
      }
      uVar10 = 1;
      do {
        local_26[uVar10] = (byte)(uVar3 >> ((byte)uVar7 & 0x1f)) & 0x3f | 0x80;
        uVar10 = uVar10 + 1;
        bVar2 = 5 < uVar7;
        uVar7 = uVar7 - 6;
      } while (bVar2);
    }
  }
  else {
    phVar5 = htmlParseEntityRef(ctxt,&local_20);
    if (local_20 == (xmlChar *)0x0) {
      htmlCheckParagraph(ctxt);
      if (ctxt->sax == (_xmlSAXHandler *)0x0) {
        return;
      }
      p_Var6 = ctxt->sax->characters;
      if (p_Var6 == (charactersSAXFunc)0x0) {
        return;
      }
      pvVar9 = ctxt->userData;
      pcVar8 = "&";
      iVar4 = 1;
      goto LAB_00151aea;
    }
    if ((phVar5 == (htmlEntityDesc *)0x0) || (uVar3 = phVar5->value, uVar3 == 0)) {
      htmlCheckParagraph(ctxt);
      if (ctxt->sax == (_xmlSAXHandler *)0x0) {
        return;
      }
      p_Var6 = ctxt->sax->characters;
      if (p_Var6 == (charactersSAXFunc)0x0) {
        return;
      }
      (*p_Var6)(ctxt->userData,(xmlChar *)"&",1);
      pvVar9 = ctxt->userData;
      p_Var6 = ctxt->sax->characters;
      iVar4 = xmlStrlen(local_20);
      (*p_Var6)(pvVar9,local_20,iVar4);
      return;
    }
    if (uVar3 < 0x80) goto LAB_00151977;
    if (uVar3 < 0x800) {
      local_26[0] = (byte)(uVar3 >> 6) | 0xc0;
      uVar7 = 0;
    }
    else if (uVar3 < 0x10000) {
      local_26[0] = (byte)(uVar3 >> 0xc) | 0xe0;
      uVar7 = 6;
    }
    else {
      local_26[0] = (byte)(uVar3 >> 0x12) & 7 | 0xf0;
      uVar7 = 0xc;
    }
    uVar10 = 1;
    do {
      local_26[uVar10] = (byte)(uVar3 >> ((byte)uVar7 & 0x1f)) & 0x3f | 0x80;
      uVar10 = uVar10 + 1;
      bVar2 = 5 < uVar7;
      uVar7 = uVar7 - 6;
    } while (bVar2);
  }
  local_26[uVar10 & 0xffffffff] = 0;
  htmlCheckParagraph(ctxt);
  if (ctxt->sax == (_xmlSAXHandler *)0x0) {
    return;
  }
  p_Var6 = ctxt->sax->characters;
  if (p_Var6 == (charactersSAXFunc)0x0) {
    return;
  }
  pvVar9 = ctxt->userData;
  pcVar8 = (char *)local_26;
  iVar4 = (int)uVar10;
LAB_00151aea:
  (*p_Var6)(pvVar9,(xmlChar *)pcVar8,iVar4);
  return;
}

Assistant:

static void
htmlParseReference(htmlParserCtxtPtr ctxt) {
    const htmlEntityDesc * ent;
    xmlChar out[6];
    const xmlChar *name;
    if (CUR != '&') return;

    if (NXT(1) == '#') {
	unsigned int c;
	int bits, i = 0;

	c = htmlParseCharRef(ctxt);
	if (c == 0)
	    return;

        if      (c <    0x80) { out[i++]= c;                bits= -6; }
        else if (c <   0x800) { out[i++]=((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) { out[i++]=((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  { out[i++]=((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            out[i++]= ((c >> bits) & 0x3F) | 0x80;
        }
	out[i] = 0;

	htmlCheckParagraph(ctxt);
	if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL))
	    ctxt->sax->characters(ctxt->userData, out, i);
    } else {
	ent = htmlParseEntityRef(ctxt, &name);
	if (name == NULL) {
	    htmlCheckParagraph(ctxt);
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL))
	        ctxt->sax->characters(ctxt->userData, BAD_CAST "&", 1);
	    return;
	}
	if ((ent == NULL) || !(ent->value > 0)) {
	    htmlCheckParagraph(ctxt);
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL)) {
		ctxt->sax->characters(ctxt->userData, BAD_CAST "&", 1);
		ctxt->sax->characters(ctxt->userData, name, xmlStrlen(name));
		/* ctxt->sax->characters(ctxt->userData, BAD_CAST ";", 1); */
	    }
	} else {
	    unsigned int c;
	    int bits, i = 0;

	    c = ent->value;
	    if      (c <    0x80)
	            { out[i++]= c;                bits= -6; }
	    else if (c <   0x800)
	            { out[i++]=((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
	    else if (c < 0x10000)
	            { out[i++]=((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
	    else
	            { out[i++]=((c >> 18) & 0x07) | 0xF0;  bits= 12; }

	    for ( ; bits >= 0; bits-= 6) {
		out[i++]= ((c >> bits) & 0x3F) | 0x80;
	    }
	    out[i] = 0;

	    htmlCheckParagraph(ctxt);
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL))
		ctxt->sax->characters(ctxt->userData, out, i);
	}
    }
}